

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O3

GLuint deqp::gls::LifetimeTests::details::getFboAttachment
                 (Functions *gl,GLuint fbo,GLenum requiredType)

{
  GLenum GVar1;
  GLuint GVar2;
  GLint name;
  GLint type;
  GLuint local_28;
  GLenum local_24;
  
  _local_28 = 0;
  (*gl->bindFramebuffer)(0x8d40,fbo);
  (*gl->getFramebufferAttachmentParameteriv)(0x8d40,0x8ce0,0x8cd0,(GLint *)&local_24);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,
                  "gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, &type)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                  ,0x100);
  GVar2 = 0;
  if (local_24 != 0 && local_24 == requiredType) {
    (*gl->getFramebufferAttachmentParameteriv)(0x8d40,0x8ce0,0x8cd1,(GLint *)&local_28);
    GVar1 = (*gl->getError)();
    glu::checkError(GVar1,
                    "gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, &name)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0x109);
    (*gl->bindFramebuffer)(0x8d40,0);
    GVar1 = (*gl->getError)();
    glu::checkError(GVar1,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0x10b);
    GVar2 = local_28;
  }
  return GVar2;
}

Assistant:

GLuint getFboAttachment (const Functions& gl, GLuint fbo, GLenum requiredType)
{
	GLint type = 0, name = 0;
	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	GLU_CHECK_CALL_ERROR(
		gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
											   GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE,
											   &type),
		gl.getError());

	if (GLenum(type) != requiredType || GLenum(type) == GL_NONE)
		return 0;

	GLU_CHECK_CALL_ERROR(
		gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
											   GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME,
											   &name),
		gl.getError());
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	GLU_CHECK_ERROR(gl.getError());

	return name;
}